

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_get_horver_correlation_full_c
               (int16_t *diff,int stride,int width,int height,float *hcorr,float *vcorr)

{
  short sVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  short *in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float xz_var_n;
  float xy_var_n;
  float z_var_n;
  float y_var_n;
  float xver_var_n;
  float xhor_var_n;
  float num_ver;
  float num_hor;
  int64_t z2_sum;
  int64_t y2_sum;
  int64_t x2ver_sum;
  int64_t x2hor_sum;
  int64_t z_sum;
  int64_t y_sum;
  int64_t xver_sum;
  int64_t xhor_sum;
  int i_2;
  int j_2;
  int16_t z_1;
  int16_t y_1;
  int16_t x_2;
  int j_1;
  int i_1;
  int16_t z;
  int16_t x_1;
  int i;
  int16_t y;
  int16_t x;
  int j;
  int64_t x2_finalcol;
  int64_t x2_firstcol;
  int64_t x2_finalrow;
  int64_t x2_firstrow;
  int64_t x_finalcol;
  int64_t x_firstcol;
  int64_t x_finalrow;
  int64_t x_firstrow;
  int64_t xz_sum;
  int64_t xy_sum;
  int64_t x2_sum;
  int64_t x_sum;
  float local_120;
  float local_118;
  int local_b0;
  int local_ac;
  int local_a0;
  int local_9c;
  int local_94;
  int local_8c;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  
  local_40 = 0;
  local_48 = 0;
  local_58 = 0;
  local_68 = 0;
  local_78 = 0;
  local_88 = 0;
  local_30 = (long)*in_RDI;
  local_38 = (long)((int)*in_RDI * (int)*in_RDI);
  local_50 = (long)*in_RDI;
  local_70 = (long)((int)*in_RDI * (int)*in_RDI);
  for (local_8c = 1; local_8c < in_EDX; local_8c = local_8c + 1) {
    sVar1 = in_RDI[local_8c];
    local_30 = sVar1 + local_30;
    local_50 = sVar1 + local_50;
    local_38 = (int)sVar1 * (int)sVar1 + local_38;
    local_70 = (int)sVar1 * (int)sVar1 + local_70;
    local_40 = (int)sVar1 * (int)in_RDI[local_8c + -1] + local_40;
  }
  local_60 = (long)*in_RDI;
  local_80 = (long)((int)*in_RDI * (int)*in_RDI);
  for (local_94 = 1; local_94 < in_ECX; local_94 = local_94 + 1) {
    sVar1 = in_RDI[local_94 * in_ESI];
    local_30 = sVar1 + local_30;
    local_60 = sVar1 + local_60;
    local_38 = (int)sVar1 * (int)sVar1 + local_38;
    local_80 = (int)sVar1 * (int)sVar1 + local_80;
    local_48 = (int)sVar1 * (int)in_RDI[(local_94 + -1) * in_ESI] + local_48;
  }
  for (local_9c = 1; local_9c < in_ECX; local_9c = local_9c + 1) {
    for (local_a0 = 1; local_a0 < in_EDX; local_a0 = local_a0 + 1) {
      sVar1 = in_RDI[local_9c * in_ESI + local_a0];
      local_30 = sVar1 + local_30;
      local_38 = (int)sVar1 * (int)sVar1 + local_38;
      local_40 = (int)sVar1 * (int)in_RDI[local_9c * in_ESI + local_a0 + -1] + local_40;
      local_48 = (int)sVar1 * (int)in_RDI[(local_9c + -1) * in_ESI + local_a0] + local_48;
    }
  }
  for (local_ac = 0; local_ac < in_EDX; local_ac = local_ac + 1) {
    local_58 = in_RDI[(in_ECX + -1) * in_ESI + local_ac] + local_58;
    local_78 = (int)in_RDI[(in_ECX + -1) * in_ESI + local_ac] *
               (int)in_RDI[(in_ECX + -1) * in_ESI + local_ac] + local_78;
  }
  for (local_b0 = 0; local_b0 < in_ECX; local_b0 = local_b0 + 1) {
    local_68 = in_RDI[local_b0 * in_ESI + in_EDX + -1] + local_68;
    local_88 = (int)in_RDI[local_b0 * in_ESI + in_EDX + -1] *
               (int)in_RDI[local_b0 * in_ESI + in_EDX + -1] + local_88;
  }
  local_68 = local_30 - local_68;
  local_58 = local_30 - local_58;
  local_60 = local_30 - local_60;
  local_30 = local_30 - local_50;
  fVar2 = (float)(in_ECX * (in_EDX + -1));
  fVar3 = (float)((in_ECX + -1) * in_EDX);
  fVar4 = (float)(local_38 - local_88) - (float)(local_68 * local_68) / fVar2;
  fVar5 = (float)(local_38 - local_78) - (float)(local_58 * local_58) / fVar3;
  fVar6 = (float)(local_38 - local_80) - (float)(local_60 * local_60) / fVar2;
  fVar7 = (float)(local_38 - local_70) - (float)(local_30 * local_30) / fVar3;
  if ((fVar4 <= 0.0) || (fVar6 <= 0.0)) {
    *in_R8 = 1.0;
  }
  else {
    fVar4 = sqrtf(fVar4 * fVar6);
    *in_R8 = ((float)local_40 - (float)(local_68 * local_60) / fVar2) / fVar4;
    if (0.0 < *in_R8 || *in_R8 == 0.0) {
      local_118 = *in_R8;
    }
    else {
      local_118 = 0.0;
    }
    *in_R8 = local_118;
  }
  if ((fVar5 <= 0.0) || (fVar7 <= 0.0)) {
    *in_R9 = 1.0;
  }
  else {
    fVar2 = sqrtf(fVar5 * fVar7);
    *in_R9 = ((float)local_48 - (float)(local_58 * local_30) / fVar3) / fVar2;
    if (0.0 < *in_R9 || *in_R9 == 0.0) {
      local_120 = *in_R9;
    }
    else {
      local_120 = 0.0;
    }
    *in_R9 = local_120;
  }
  return;
}

Assistant:

void av1_get_horver_correlation_full_c(const int16_t *diff, int stride,
                                       int width, int height, float *hcorr,
                                       float *vcorr) {
  // The following notation is used:
  // x - current pixel
  // y - left neighbor pixel
  // z - top neighbor pixel
  int64_t x_sum = 0, x2_sum = 0, xy_sum = 0, xz_sum = 0;
  int64_t x_firstrow = 0, x_finalrow = 0, x_firstcol = 0, x_finalcol = 0;
  int64_t x2_firstrow = 0, x2_finalrow = 0, x2_firstcol = 0, x2_finalcol = 0;

  // First, process horizontal correlation on just the first row
  x_sum += diff[0];
  x2_sum += diff[0] * diff[0];
  x_firstrow += diff[0];
  x2_firstrow += diff[0] * diff[0];
  for (int j = 1; j < width; ++j) {
    const int16_t x = diff[j];
    const int16_t y = diff[j - 1];
    x_sum += x;
    x_firstrow += x;
    x2_sum += x * x;
    x2_firstrow += x * x;
    xy_sum += x * y;
  }

  // Process vertical correlation in the first column
  x_firstcol += diff[0];
  x2_firstcol += diff[0] * diff[0];
  for (int i = 1; i < height; ++i) {
    const int16_t x = diff[i * stride];
    const int16_t z = diff[(i - 1) * stride];
    x_sum += x;
    x_firstcol += x;
    x2_sum += x * x;
    x2_firstcol += x * x;
    xz_sum += x * z;
  }

  // Now process horiz and vert correlation through the rest unit
  for (int i = 1; i < height; ++i) {
    for (int j = 1; j < width; ++j) {
      const int16_t x = diff[i * stride + j];
      const int16_t y = diff[i * stride + j - 1];
      const int16_t z = diff[(i - 1) * stride + j];
      x_sum += x;
      x2_sum += x * x;
      xy_sum += x * y;
      xz_sum += x * z;
    }
  }

  for (int j = 0; j < width; ++j) {
    x_finalrow += diff[(height - 1) * stride + j];
    x2_finalrow +=
        diff[(height - 1) * stride + j] * diff[(height - 1) * stride + j];
  }
  for (int i = 0; i < height; ++i) {
    x_finalcol += diff[i * stride + width - 1];
    x2_finalcol += diff[i * stride + width - 1] * diff[i * stride + width - 1];
  }

  int64_t xhor_sum = x_sum - x_finalcol;
  int64_t xver_sum = x_sum - x_finalrow;
  int64_t y_sum = x_sum - x_firstcol;
  int64_t z_sum = x_sum - x_firstrow;
  int64_t x2hor_sum = x2_sum - x2_finalcol;
  int64_t x2ver_sum = x2_sum - x2_finalrow;
  int64_t y2_sum = x2_sum - x2_firstcol;
  int64_t z2_sum = x2_sum - x2_firstrow;

  const float num_hor = (float)(height * (width - 1));
  const float num_ver = (float)((height - 1) * width);

  const float xhor_var_n = x2hor_sum - (xhor_sum * xhor_sum) / num_hor;
  const float xver_var_n = x2ver_sum - (xver_sum * xver_sum) / num_ver;

  const float y_var_n = y2_sum - (y_sum * y_sum) / num_hor;
  const float z_var_n = z2_sum - (z_sum * z_sum) / num_ver;

  const float xy_var_n = xy_sum - (xhor_sum * y_sum) / num_hor;
  const float xz_var_n = xz_sum - (xver_sum * z_sum) / num_ver;

  if (xhor_var_n > 0 && y_var_n > 0) {
    *hcorr = xy_var_n / sqrtf(xhor_var_n * y_var_n);
    *hcorr = *hcorr < 0 ? 0 : *hcorr;
  } else {
    *hcorr = 1.0;
  }
  if (xver_var_n > 0 && z_var_n > 0) {
    *vcorr = xz_var_n / sqrtf(xver_var_n * z_var_n);
    *vcorr = *vcorr < 0 ? 0 : *vcorr;
  } else {
    *vcorr = 1.0;
  }
}